

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O1

void __thiscall helics::ipc::IpcComms::loadNetworkInfo(IpcComms *this,NetworkBrokerData *netInfo)

{
  string *this_00;
  bool bVar1;
  
  CommsInterface::loadNetworkInfo(&this->super_CommsInterface,netInfo);
  bVar1 = CommsInterface::propertyLock(&this->super_CommsInterface);
  if (bVar1) {
    if ((this->super_CommsInterface).localTargetAddress._M_string_length == 0) {
      this_00 = &(this->super_CommsInterface).localTargetAddress;
      if ((this->super_CommsInterface).serverMode == true) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,0,0,
                   "_ipc_broker",0xb);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(this->super_CommsInterface).name);
      }
    }
    CommsInterface::propertyUnLock(&this->super_CommsInterface);
    return;
  }
  return;
}

Assistant:

void IpcComms::loadNetworkInfo(const NetworkBrokerData& netInfo)
    {
        CommsInterface::loadNetworkInfo(netInfo);
        if (!propertyLock()) {
            return;
        }
        // brokerPort = netInfo.brokerPort;
        // PortNumber = netInfo.portNumber;
        if (localTargetAddress.empty()) {
            if (serverMode) {
                localTargetAddress = "_ipc_broker";
            } else {
                localTargetAddress = name;
            }
        }

        // if (PortNumber > 0)
        //{
        //    autoPortNumber = false;
        //}
        propertyUnLock();
    }